

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QPointF>::reallocate
          (QPodArrayOps<QPointF> *this,qsizetype alloc,AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QPointF>_*,_QPointF_*> pVar2;
  pair<QTypedArrayData<QPointF>_*,_QPointF_*> pair;
  QPointF *pQStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<QPointF>::reallocateUnaligned
                    ((QTypedArrayData<QPointF> *)0xaaaaaaaaaaaaaaaa,in_RDI,in_RSI,in_EDX);
  qt_noop();
  in_RDI->xp = (qreal)pVar2.first;
  pQStack_10 = pVar2.second;
  in_RDI->yp = (qreal)pQStack_10;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }